

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

unique_ptr<cmInstallFileSetGenerator,_std::default_delete<cmInstallFileSetGenerator>_> __thiscall
anon_unknown.dwarf_132b90d::CreateInstallFileSetGenerator
          (anon_unknown_dwarf_132b90d *this,Helper *helper,cmTarget *target,cmFileSet *fileSet,
          string *destination,cmInstallCommandArguments *args)

{
  string *__args_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_5;
  bool local_66;
  undefined1 local_65;
  MessageLevel message;
  string *local_60;
  string *local_58;
  string *local_50;
  cmFileSet *fileSet_local;
  undefined8 local_38;
  
  local_50 = destination;
  fileSet_local = fileSet;
  message = cmInstallGenerator::SelectMessageLevel(helper->Makefile,false);
  local_58 = cmTarget::GetName_abi_cxx11_(target);
  __args_4 = cmInstallCommandArguments::GetPermissions_abi_cxx11_(args);
  __args_5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             cmInstallCommandArguments::GetConfigurations_abi_cxx11_(args);
  local_60 = cmInstallCommandArguments::GetComponent_abi_cxx11_(args);
  local_66 = cmInstallCommandArguments::GetExcludeFromAll(args);
  local_65 = cmInstallCommandArguments::GetOptional(args);
  cmMakefile::GetBacktrace(helper->Makefile);
  std::
  make_unique<cmInstallFileSetGenerator,std::__cxx11::string_const&,cmFileSet*&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,cmInstallGenerator::MessageLevel&,bool,bool,cmListFileBacktrace>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (cmFileSet **)local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fileSet_local,
             local_50,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)__args_4,__args_5,(MessageLevel *)local_60,(bool *)&message,&local_66,
             (cmListFileBacktrace *)&local_65);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  return (__uniq_ptr_data<cmInstallFileSetGenerator,_std::default_delete<cmInstallFileSetGenerator>,_true,_true>
          )(__uniq_ptr_data<cmInstallFileSetGenerator,_std::default_delete<cmInstallFileSetGenerator>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmInstallFileSetGenerator> CreateInstallFileSetGenerator(
  Helper& helper, cmTarget& target, cmFileSet* fileSet,
  const std::string& destination, const cmInstallCommandArguments& args)
{
  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(helper.Makefile);
  return cm::make_unique<cmInstallFileSetGenerator>(
    target.GetName(), fileSet, destination, args.GetPermissions(),
    args.GetConfigurations(), args.GetComponent(), message,
    args.GetExcludeFromAll(), args.GetOptional(),
    helper.Makefile->GetBacktrace());
}